

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

int gzrewind(gzFile file)

{
  int iVar1;
  __off64_t _Var2;
  int iVar3;
  
  iVar3 = -1;
  if (((file != (gzFile)0x0) && (file[1].have == 0x1c4f)) &&
     ((iVar1 = *(int *)((long)&file[4].pos + 4), iVar1 == 0 || (iVar1 == -5)))) {
    _Var2 = lseek64(*(int *)&file[1].field_0x4,*(__off64_t *)(file + 3),0);
    if (_Var2 != -1) {
      gz_reset((gz_statep)file);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT gzrewind(gzFile file) {
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* back up and start over */
    if (LSEEK(state->fd, state->start, SEEK_SET) == -1)
        return -1;
    gz_reset(state);
    return 0;
}